

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O1

XSWildcard * __thiscall
xercesc_4_0::XSObjectFactory::createXSWildcard
          (XSObjectFactory *this,SchemaAttDef *attDef,XSModel *xsModel)

{
  BaseRefVectorOf<xercesc_4_0::XSObject> *this_00;
  XMLSize_t XVar1;
  XSAnnotation *annot;
  XSWildcard *this_01;
  SchemaAttDef *key;
  
  key = attDef->fBaseAttDecl;
  if (attDef->fBaseAttDecl == (SchemaAttDef *)0x0) {
    key = attDef;
  }
  annot = getAnnotationFromModel(this,xsModel,key);
  this_01 = (XSWildcard *)XMemory::operator_new(0x40,this->fMemoryManager);
  XSWildcard::XSWildcard(this_01,attDef,annot,xsModel,this->fMemoryManager);
  this_00 = &this->fDeleteVector->super_BaseRefVectorOf<xercesc_4_0::XSObject>;
  BaseRefVectorOf<xercesc_4_0::XSObject>::ensureExtraCapacity(this_00,1);
  XVar1 = this_00->fCurCount;
  this_00->fElemList[XVar1] = (XSObject *)this_01;
  this_00->fCurCount = XVar1 + 1;
  return this_01;
}

Assistant:

XSWildcard*
XSObjectFactory::createXSWildcard(SchemaAttDef* const attDef,
                                  XSModel* const xsModel)
{
    XSAnnotation* annot = (attDef->getBaseAttDecl())
        ? getAnnotationFromModel(xsModel, attDef->getBaseAttDecl())
        : getAnnotationFromModel(xsModel, attDef);

    XSWildcard* xsWildcard = new (fMemoryManager) XSWildcard
    (
        attDef
        , annot
        , xsModel
        , fMemoryManager
    );
    fDeleteVector->addElement(xsWildcard);

    return xsWildcard;
}